

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O1

string * __thiscall
BayesianGameIdenticalPayoff::SoftPrintUtilForJointType_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameIdenticalPayoff *this,Index jtype)

{
  ostream *poVar1;
  ulong uVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  stringstream ss;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Utility function for jtype ",0x1b);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"with prob.=",0xb);
  (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
    super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
    _vptr_Interface_ProblemToPolicyDiscrete[0xd])(this,(ulong)jtype);
  poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"jtype\tja\tu(jtype,ja)",0x14);
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  if ((this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJA != 0) {
    uVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
        super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
        _vptr_Interface_ProblemToPolicyDiscrete[0x10])(this,(ulong)jtype,uVar2);
      poVar1 = std::ostream::_M_insert<double>(extraout_XMM0_Qa_00);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 < (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                     _m_nrJA);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameIdenticalPayoff::SoftPrintUtilForJointType(Index jtype) const
{
    stringstream ss;
    ss << "Utility function for jtype "<<jtype << 
        "with prob.="<< GetProbability(jtype) << endl;
    ss << "jtype\tja\tu(jtype,ja)"<<endl;
    for(Index jaI=0; jaI < _m_nrJA; jaI++)
        ss << jtype << "\t" << jaI << "\t" << GetUtility(jtype, jaI)<<endl;
    return(ss.str());
}